

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectCast.h
# Opt level: O0

PDFDictionary * PDFObjectCast<PDFDictionary>(PDFObject *inOriginal)

{
  EPDFObjectType EVar1;
  PDFObject *inOriginal_local;
  
  if (inOriginal == (PDFObject *)0x0) {
    inOriginal_local = (PDFObject *)0x0;
  }
  else {
    EVar1 = PDFObject::GetType(inOriginal);
    inOriginal_local = inOriginal;
    if (EVar1 != ePDFObjectDictionary) {
      RefCountObject::Release(&inOriginal->super_RefCountObject);
      inOriginal_local = (PDFObject *)0x0;
    }
  }
  return (PDFDictionary *)inOriginal_local;
}

Assistant:

T* PDFObjectCast(PDFObject* inOriginal)
{
	if(!inOriginal)
		return NULL;

	if(inOriginal->GetType() == (PDFObject::EPDFObjectType)T::eType)
	{
		return (T*)inOriginal;
	}
	else
	{
		inOriginal->Release();
		return NULL;
	}
}